

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldBase::Swap(MapFieldBase *this,MapFieldBase *other)

{
  MapFieldBase *other_local;
  MapFieldBase *this_local;
  
  if (this->arena_ == other->arena_) {
    InternalSwap(this,other);
  }
  else {
    if ((this->repeated_field_ != (RepeatedPtrField<google::protobuf::Message> *)0x0) ||
       (other->repeated_field_ != (RepeatedPtrField<google::protobuf::Message> *)0x0)) {
      if (this->repeated_field_ == (RepeatedPtrField<google::protobuf::Message> *)0x0) {
        SwapRepeatedPtrToNull
                  (&other->repeated_field_,&this->repeated_field_,other->arena_,this->arena_);
      }
      else if (other->repeated_field_ == (RepeatedPtrField<google::protobuf::Message> *)0x0) {
        SwapRepeatedPtrToNull
                  (&this->repeated_field_,&other->repeated_field_,this->arena_,other->arena_);
      }
      else {
        RepeatedPtrField<google::protobuf::Message>::Swap
                  (this->repeated_field_,other->repeated_field_);
      }
    }
    SwapState(this,other);
  }
  return;
}

Assistant:

void MapFieldBase::Swap(MapFieldBase* other) {
  if (arena_ == other->arena_) {
    InternalSwap(other);
    return;
  }
  if (repeated_field_ != nullptr || other->repeated_field_ != nullptr) {
    if (repeated_field_ == nullptr) {
      SwapRepeatedPtrToNull(&other->repeated_field_, &repeated_field_,
                            other->arena_, arena_);
    } else if (other->repeated_field_ == nullptr) {
      SwapRepeatedPtrToNull(&repeated_field_, &other->repeated_field_, arena_,
                            other->arena_);
    } else {
      repeated_field_->Swap(other->repeated_field_);
    }
  }
  SwapState(other);
}